

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

vector * __thiscall lsh::table::query(vector *__return_storage_ptr__,table *this,vector *v)

{
  uint *puVar1;
  vector *pvVar2;
  table *ptVar3;
  uint uVar4;
  ulong uVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  invalid_argument *this_00;
  uint *puVar8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  vector *pvVar9;
  uint uVar10;
  uint u;
  vector k;
  uint local_84;
  vector *local_80;
  vector *local_78;
  ulong local_70;
  table *local_68;
  ulong local_60;
  undefined1 local_58 [8];
  pointer puStack_50;
  _Bit_type *local_48;
  pointer puStack_40;
  _Bit_pointer local_38;
  
  uVar10 = this->dimensions_;
  local_80 = v;
  uVar4 = vector::size(v);
  if (uVar10 != uVar4) {
LAB_001319d8:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar5 = ((long)(this->partitions_).
                 super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->partitions_).
                 super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if ((int)uVar5 != 0) {
    local_70 = uVar5 & 0xffffffff;
    uVar10 = 0xffffffff;
    uVar5 = 0;
    pvVar9 = (vector *)0x0;
    local_78 = __return_storage_ptr__;
    local_68 = this;
    do {
      ptVar3 = local_68;
      vector::operator&((vector *)local_58,
                        (local_68->masks_).
                        super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar5,local_80);
      this_01 = &(ptVar3->partitions_).
                 super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_h;
      local_84 = vector::hash((vector *)local_58);
      cVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_01,&local_84);
      local_60 = uVar5;
      if (cVar6.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        local_84 = vector::hash((vector *)local_58);
        cVar6 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_01,&local_84);
        if (cVar6.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
LAB_001319cc:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_001319d8;
        }
        puVar1 = *(uint **)((long)cVar6.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                  ._M_cur + 0x18);
        for (puVar8 = *(uint **)((long)cVar6.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                       ._M_cur + 0x10); puVar8 != puVar1; puVar8 = puVar8 + 1) {
          local_84 = *puVar8;
          cVar7 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_lsh::vector>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->vectors_)._M_h,&local_84);
          if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_lsh::vector>,_false>.
              _M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
            goto LAB_001319cc;
          }
          uVar4 = vector::distance(local_80,(vector *)
                                            ((long)cVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_lsh::vector>,_false>
                                                  ._M_cur + 0x10));
          if (uVar4 < uVar10) {
            pvVar9 = (vector *)
                     ((long)cVar7.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_lsh::vector>,_false>
                            ._M_cur + 0x10);
            uVar10 = uVar4;
          }
        }
      }
      if (puStack_50 != (pointer)0x0) {
        operator_delete(puStack_50);
      }
      pvVar2 = local_78;
      uVar5 = local_60 + 1;
    } while (uVar5 != local_70);
    __return_storage_ptr__ = local_78;
    if (pvVar9 != (vector *)0x0) {
      local_78->size_ = pvVar9->size_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_78->components_,&pvVar9->components_);
      return pvVar2;
    }
  }
  local_48 = (_Bit_type *)0x0;
  puStack_40 = (pointer)0x0;
  local_58 = (undefined1  [8])0x0;
  puStack_50 = (pointer)0x0;
  local_38 = (_Bit_pointer)0x0;
  vector::vector(__return_storage_ptr__,(vector<bool,_std::allocator<bool>_> *)local_58);
  if (local_58 != (undefined1  [8])0x0) {
    operator_delete((void *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector table::query(const vector& v) const {
    if (this->dimensions_ != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int n = this->partitions_.size();

    // Keep track of the best candidate we've encountered.
    const vector* best_c = nullptr;

    // Keep track of the distance to the best candidate.
    unsigned int best_d = UINT_MAX;

    for (unsigned int i = 0; i < n; i++) {
      vector k = this->masks_[i] & v;
      const partition& p = this->partitions_[i];

      auto it = p.find(k.hash());

      if (it == p.end()) {
        continue;
      }

      const bucket& b = p.at(k.hash());

      for (unsigned int u: b) {
        const vector& c = this->vectors_.at(u);

        unsigned int d = vector::distance(v, c);

        if (d < best_d) {
          best_c = &c;
          best_d = d;
        }
      }
    }

    return best_c ? *best_c : vector({});
  }